

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.h
# Opt level: O3

bool __thiscall
pbrt::ParseArg<pstd::span<float>>
          (pbrt *this,char ***argv,string *name,span<float> out,
          function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
          *onError)

{
  string *psVar1;
  char *__s;
  bool bVar2;
  int iVar3;
  long lVar4;
  bool bVar5;
  span<float> out_00;
  span<float> out_01;
  string value;
  string arg;
  __string_type __str;
  string ret;
  undefined1 local_100 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d0;
  size_t local_c0;
  string *local_b8;
  anon_unknown_4 *local_b0;
  string *local_a8;
  long local_a0 [2];
  string local_90;
  string local_70;
  string local_50;
  
  local_c0 = out.n;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_e0._M_local_buf,(char *)**(undefined8 **)this,
             (allocator<char> *)local_100);
  if (*(char *)(local_e0._M_allocated_capacity + 1) == '-') {
    std::__cxx11::string::substr((ulong)local_100,(ulong)&local_e0);
  }
  else {
    std::__cxx11::string::substr((ulong)local_100,(ulong)&local_e0);
  }
  std::__cxx11::string::operator=((string *)local_e0._M_local_buf,(string *)local_100);
  if ((string *)local_100._0_8_ != (string *)(local_100 + 0x10)) {
    operator_delete((void *)local_100._0_8_,local_100._16_8_ + 1);
  }
  anon_unknown_4::normalizeArg
            ((string *)local_100,(anon_unknown_4 *)local_e0._M_allocated_capacity,
             (string *)local_e0._8_8_);
  local_b0 = (anon_unknown_4 *)local_a0;
  std::__cxx11::string::_M_construct<char*>((string *)&local_b0,*argv,(long)argv[1] + (long)*argv);
  std::__cxx11::string::_M_replace_aux((ulong)&local_b0,(ulong)local_a8,0,'\x01');
  anon_unknown_4::normalizeArg(&local_90,local_b0,local_a8);
  if ((ulong)local_100._8_8_ < local_90._M_string_length) {
    bVar2 = false;
  }
  else if ((float *)local_90._M_string_length == (float *)0x0) {
    bVar2 = true;
  }
  else {
    lVar4 = 0;
    do {
      bVar2 = local_90._M_dataplus._M_p[lVar4] == *(char *)(local_100._0_8_ + lVar4);
      if (!bVar2) break;
      bVar5 = local_90._M_string_length + -1 != lVar4;
      lVar4 = lVar4 + 1;
    } while (bVar5);
  }
  local_b8 = name;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if (local_b0 != (anon_unknown_4 *)local_a0) {
    operator_delete(local_b0,local_a0[0] + 1);
  }
  psVar1 = (string *)(local_100 + 0x10);
  if ((string *)local_100._0_8_ != psVar1) {
    operator_delete((void *)local_100._0_8_,local_100._16_8_ + 1);
  }
  if (bVar2) {
    *(long *)this = *(long *)this + 8;
    std::__cxx11::string::substr((ulong)local_100,(ulong)&local_e0);
    out_00.n = (size_t)local_b8;
    out_00.ptr = (float *)local_100._8_8_;
    bVar2 = anon_unknown_4::initArg((string *)local_100._0_8_,out_00);
    if (!bVar2) {
      local_50._M_string_length = 0;
      local_50.field_2._M_local_buf[0] = '\0';
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      detail::stringPrintfRecursive<std::__cxx11::string&,std::__cxx11::string_const&>
                (&local_50,"invalid value \"%s\" for %s argument",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)argv);
      if (*(long *)(local_c0 + 0x10) == 0) {
        std::__throw_bad_function_call();
      }
      (**(code **)(local_c0 + 0x18))(local_c0,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,
                        CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                                 local_50.field_2._M_local_buf[0]) + 1);
      }
    }
    if ((string *)local_100._0_8_ != psVar1) {
      operator_delete((void *)local_100._0_8_,local_100._16_8_ + 1);
    }
  }
  else {
    anon_unknown_4::normalizeArg
              ((string *)local_100,(anon_unknown_4 *)local_e0._M_allocated_capacity,
               (string *)local_e0._8_8_);
    anon_unknown_4::normalizeArg(&local_90,(anon_unknown_4 *)*argv,(string *)argv[1]);
    if (local_100._8_8_ == local_90._M_string_length) {
      if ((float *)local_100._8_8_ == (float *)0x0) {
        bVar2 = true;
      }
      else {
        iVar3 = bcmp((void *)local_100._0_8_,local_90._M_dataplus._M_p,local_100._8_8_);
        bVar2 = iVar3 == 0;
      }
    }
    else {
      bVar2 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if ((string *)local_100._0_8_ != psVar1) {
      operator_delete((void *)local_100._0_8_,local_100._16_8_ + 1);
    }
    if (bVar2) {
      lVar4 = *(long *)this;
      *(long *)this = lVar4 + 8;
      __s = *(char **)(lVar4 + 8);
      if (__s != (char *)0x0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_100,__s,(allocator<char> *)&local_90);
        out_01.n = (size_t)local_b8;
        out_01.ptr = (float *)local_100._8_8_;
        anon_unknown_4::initArg((string *)local_100._0_8_,out_01);
        if ((string *)local_100._0_8_ != psVar1) {
          operator_delete((void *)local_100._0_8_,local_100._16_8_ + 1);
        }
        *(long *)this = *(long *)this + 8;
        bVar2 = true;
        goto LAB_0024d672;
      }
      local_70._M_string_length = 0;
      local_70.field_2._M_local_buf[0] = '\0';
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      detail::stringPrintfRecursive<std::__cxx11::string&>
                (&local_70,"missing value after %s argument",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_e0);
      if (*(long *)(local_c0 + 0x10) == 0) {
        std::__throw_bad_function_call();
      }
      (**(code **)(local_c0 + 0x18))(local_c0,&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,
                        CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                                 local_70.field_2._M_local_buf[0]) + 1);
      }
    }
    bVar2 = false;
  }
LAB_0024d672:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_allocated_capacity != &local_d0) {
    operator_delete((void *)local_e0._M_allocated_capacity,local_d0._M_allocated_capacity + 1);
  }
  return bVar2;
}

Assistant:

bool ParseArg(char ***argv, const std::string &name, T out,
              std::function<void(std::string)> onError) {
    std::string arg = **argv;

    // Strip either one or two leading dashes.
    if (arg[1] == '-')
        arg = arg.substr(2);
    else
        arg = arg.substr(1);

    if (matchPrefix(normalizeArg(arg), normalizeArg(name + '='))) {
        // --arg=value
        *argv += 1;
        std::string value = arg.substr(name.size() + 1);
        if (!initArg(value, out)) {
            onError(StringPrintf("invalid value \"%s\" for %s argument", value, name));
            return false;
        }
        return true;
    } else if (normalizeArg(arg) == normalizeArg(name)) {
        // --arg <value>, except for bool arguments, which are set to true
        // without expecting another argument.
        *argv += 1;
        if (enable(out))
            return true;

        if (**argv == nullptr) {
            onError(StringPrintf("missing value after %s argument", arg));
            return false;
        }
        initArg(**argv, out);
        *argv += 1;
        return true;
    } else
        return false;
}